

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O3

void unpackforblock27(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t *puVar16;
  uint uVar17;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  uVar15 = puVar1[0xd];
  puVar16 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 0x6c);
  *puVar16 = ((uint)uVar2 & 0x7ffffff) + base;
  puVar16[1] = ((uint)(uVar2 >> 0x1b) & 0x7ffffff) + base;
  puVar16[2] = ((uint)(uVar3 << 10) & 0x7ffffff | (uint)(uVar2 >> 0x36)) + base;
  puVar16[3] = ((uint)(uVar3 >> 0x11) & 0x7ffffff) + base;
  puVar16[4] = ((uint)(uVar4 << 0x14) & 0x7ffffff | (uint)(uVar3 >> 0x2c)) + base;
  puVar16[5] = ((uint)(uVar4 >> 7) & 0x7ffffff) + base;
  uVar17 = (uint)(uVar4 >> 0x20);
  puVar16[10] = ((uint)(uVar6 >> 0xe) & 0x7ffffff) + base;
  puVar16[0xb] = ((uint)(uVar7 << 0x17) & 0x7ffffff | (uint)(uVar6 >> 0x29)) + base;
  puVar16[0xc] = ((uint)(uVar7 >> 4) & 0x7ffffff) + base;
  puVar16[0xd] = ((uint)(uVar7 >> 0x1f) & 0x7ffffff) + base;
  puVar16[6] = (uVar17 >> 2 & 0x7ffffff) + base;
  puVar16[7] = ((uint)(uVar5 << 3) & 0x7ffffff | uVar17 >> 0x1d) + base;
  puVar16[8] = ((uint)(uVar5 >> 0x18) & 0x7ffffff) + base;
  puVar16[9] = ((uint)(uVar6 << 0xd) & 0x7ffffff | (uint)(uVar5 >> 0x33)) + base;
  puVar16[0x12] = ((uint)(uVar10 << 0x1a) & 0x7ffffff | (uint)(uVar9 >> 0x26)) + base;
  puVar16[0x13] = ((uint)(uVar10 >> 1) & 0x7ffffff) + base;
  puVar16[0x14] = ((uint)(uVar10 >> 0x1c) & 0x7ffffff) + base;
  puVar16[0x15] = ((uint)(uVar11 << 9) & 0x7ffffff | (uint)(uVar10 >> 0x37)) + base;
  puVar16[0xe] = ((uint)(uVar7 >> 0x3a) | (uint)(uVar8 << 6) & 0x7ffffff) + base;
  puVar16[0xf] = ((uint)(uVar8 >> 0x15) & 0x7ffffff) + base;
  puVar16[0x10] = ((uint)(uVar9 << 0x10) & 0x7ffffff | (uint)(ushort)(uVar8 >> 0x30)) + base;
  puVar16[0x11] = ((uint)(uVar9 >> 0xb) & 0x7ffffff) + base;
  puVar16[0x16] = ((uint)(uVar11 >> 0x12) & 0x7ffffff) + base;
  puVar16[0x17] = ((uint)(uVar12 << 0x13) & 0x7ffffff | (uint)(uVar11 >> 0x2d)) + base;
  puVar16[0x18] = ((uint)(uVar12 >> 8) & 0x7ffffff) + base;
  uVar17 = (uint)(uVar12 >> 0x20);
  puVar16[0x19] = (uVar17 >> 3 & 0x7ffffff) + base;
  puVar16[0x1a] = ((uint)(uVar13 << 2) & 0x7ffffff | uVar17 >> 0x1e) + base;
  puVar16[0x1b] = ((uint)(uVar13 >> 0x19) & 0x7ffffff) + base;
  puVar16[0x1c] = ((uint)(uVar14 << 0xc) & 0x7ffffff | (uint)(uVar13 >> 0x34)) + base;
  puVar16[0x1d] = ((uint)(uVar14 >> 0xf) & 0x7ffffff) + base;
  puVar16[0x1e] = ((uint)(uVar15 << 0x16) & 0x7ffffff | (uint)(uVar14 >> 0x2a)) + base;
  puVar16[0x1f] = ((uint)(uVar15 >> 5) & 0x7ffffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock27(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(134217727);
  /* we are going to access  14 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  *pw += 108; /* we used up 108 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 27) & mask);
  out[2] = base + (uint32_t)(((w0 >> 54) | (w1 << 10)) & mask);
  out[3] = base + (uint32_t)((w1 >> 17) & mask);
  out[4] = base + (uint32_t)(((w1 >> 44) | (w2 << 20)) & mask);
  out[5] = base + (uint32_t)((w2 >> 7) & mask);
  out[6] = base + (uint32_t)((w2 >> 34) & mask);
  out[7] = base + (uint32_t)(((w2 >> 61) | (w3 << 3)) & mask);
  out[8] = base + (uint32_t)((w3 >> 24) & mask);
  out[9] = base + (uint32_t)(((w3 >> 51) | (w4 << 13)) & mask);
  out[10] = base + (uint32_t)((w4 >> 14) & mask);
  out[11] = base + (uint32_t)(((w4 >> 41) | (w5 << 23)) & mask);
  out[12] = base + (uint32_t)((w5 >> 4) & mask);
  out[13] = base + (uint32_t)((w5 >> 31) & mask);
  out[14] = base + (uint32_t)(((w5 >> 58) | (w6 << 6)) & mask);
  out[15] = base + (uint32_t)((w6 >> 21) & mask);
  out[16] = base + (uint32_t)(((w6 >> 48) | (w7 << 16)) & mask);
  out[17] = base + (uint32_t)((w7 >> 11) & mask);
  out[18] = base + (uint32_t)(((w7 >> 38) | (w8 << 26)) & mask);
  out[19] = base + (uint32_t)((w8 >> 1) & mask);
  out[20] = base + (uint32_t)((w8 >> 28) & mask);
  out[21] = base + (uint32_t)(((w8 >> 55) | (w9 << 9)) & mask);
  out[22] = base + (uint32_t)((w9 >> 18) & mask);
  out[23] = base + (uint32_t)(((w9 >> 45) | (w10 << 19)) & mask);
  out[24] = base + (uint32_t)((w10 >> 8) & mask);
  out[25] = base + (uint32_t)((w10 >> 35) & mask);
  out[26] = base + (uint32_t)(((w10 >> 62) | (w11 << 2)) & mask);
  out[27] = base + (uint32_t)((w11 >> 25) & mask);
  out[28] = base + (uint32_t)(((w11 >> 52) | (w12 << 12)) & mask);
  out[29] = base + (uint32_t)((w12 >> 15) & mask);
  out[30] = base + (uint32_t)(((w12 >> 42) | (w13 << 22)) & mask);
  out[31] = base + (uint32_t)((w13 >> 5) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}